

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O1

ES5HeapArgumentsObject * __thiscall
Js::HeapArgumentsObject::ConvertToES5HeapArgumentsObject_TTD(HeapArgumentsObject *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((this->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject !=
      (_func_int **)VirtualTableInfo<Js::HeapArgumentsObject>::Address) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArgumentsObject.cpp"
                                ,0x10b,
                                "(VirtualTableInfo<HeapArgumentsObject>::HasVirtualTable(this))",
                                "VirtualTableInfo<HeapArgumentsObject>::HasVirtualTable(this)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (this->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)VirtualTableInfo<Js::ES5HeapArgumentsObject>::Address;
  return (ES5HeapArgumentsObject *)this;
}

Assistant:

ES5HeapArgumentsObject* HeapArgumentsObject::ConvertToES5HeapArgumentsObject_TTD()
    {
        Assert(VirtualTableInfo<HeapArgumentsObject>::HasVirtualTable(this));
        VirtualTableInfo<ES5HeapArgumentsObject>::SetVirtualTable(this);

        return static_cast<ES5HeapArgumentsObject*>(this);
    }